

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall kratos::DependencyVisitor::visit_assign(DependencyVisitor *this,AssignStmt *assign)

{
  _Hashtable<kratos::Stmt*,kratos::Stmt*,std::allocator<kratos::Stmt*>,std::__detail::_Identity,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var1;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var2;
  _Hash_node_base *p_Var3;
  __hashtable *__h;
  __node_base _Var4;
  __node_base _Var5;
  DepSet local_b0;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_40;
  AssignStmt *local_38;
  AssignStmt *assign_local;
  
  local_38 = assign;
  get_dep(&local_b0,assign->right_);
  if (local_b0.first._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var4._M_nxt = local_b0.first._M_h._M_before_begin._M_nxt;
    do {
      p_Var1 = (_Hashtable<kratos::Stmt*,kratos::Stmt*,std::allocator<kratos::Stmt*>,std::__detail::_Identity,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->dependency_,(key_type *)(_Var4._M_nxt + 1));
      std::
      _Hashtable<kratos::Stmt*,kratos::Stmt*,std::allocator<kratos::Stmt*>,std::__detail::_Identity,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<kratos::AssignStmt*&>(p_Var1,&local_38);
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
    } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
  }
  if (local_b0.second._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var5._M_nxt = local_b0.second._M_h._M_before_begin._M_nxt;
    do {
      p_Var2 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->linked_dependency_,(key_type *)(_Var5._M_nxt + 1));
      local_40 = p_Var2;
      for (p_Var3 = _Var5._M_nxt[4]._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
          p_Var3 = p_Var3->_M_nxt) {
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_insert<std::pair<unsigned_int_const,kratos::Var*>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,kratos::Var*>,false>>>>
                  (p_Var2,p_Var3 + 1,&local_40);
      }
      _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
    } while (_Var5._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b0.second._M_h);
  std::
  _Hashtable<const_kratos::Var_*,_const_kratos::Var_*,_std::allocator<const_kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_const_kratos::Var_*,_std::allocator<const_kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  return;
}

Assistant:

void visit_assign(AssignStmt *assign) {
        auto const &[dep, linked] = get_dep(assign->right());
        for (auto const &v : dep) dependency_[v].emplace(assign);
        for (auto const &[var, entry] : linked) {
            linked_dependency_[var].insert(entry.begin(), entry.end());
        }
    }